

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O2

void Assimp::IFC::ProcessBooleanHalfSpaceDifference
               (IfcHalfSpaceSolid *hs,TempMesh *result,TempMesh *first_operand,
               ConversionData *param_4)

{
  pointer *ppaVar1;
  uint *puVar2;
  TempMesh *pTVar3;
  TempMesh *pTVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  value_type_conflict1 vVar9;
  IfcSurface *pIVar10;
  IfcPlane *pIVar11;
  IfcAxis2Placement3D *pIVar12;
  Lazy *this;
  IfcDirection *in;
  IfcCartesianPoint *in_00;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  _Var13;
  const_iterator __last;
  pointer paVar14;
  uint uVar15;
  undefined1 *this_00;
  ulong uVar16;
  uint *puVar17;
  value_type *e0;
  ulong uVar18;
  char *unaff_retaddr;
  value_type_conflict1 local_f0;
  uint local_ec;
  TempMesh *local_e8;
  TempMesh *local_e0;
  IfcVector3 vmax;
  IfcVector3 local_b8;
  IfcVector3 vmin;
  IfcVector3 p;
  FuzzyVectorCompare fz;
  
  local_e0 = first_operand;
  if (hs == (IfcHalfSpaceSolid *)0x0) {
    __assert_fail("hs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0x8f,
                  "void Assimp::IFC::ProcessBooleanHalfSpaceDifference(const Schema_2x3::IfcHalfSpaceSolid *, TempMesh &, const TempMesh &, ConversionData &)"
                 );
  }
  pIVar10 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSurface>::operator->
                      ((Lazy<Assimp::IFC::Schema_2x3::IfcSurface> *)
                       &(hs->super_IfcGeometricRepresentationItem).field_0x30);
  pIVar11 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPlane>
                      ((Object *)
                       ((long)&(pIVar10->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper +
                       (long)(pIVar10->super_IfcGeometricRepresentationItem).
                             super_IfcRepresentationItem.
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                             ._vptr_ObjectHelper[-3]));
  if (pIVar11 != (IfcPlane *)0x0) {
    p.x = 0.0;
    p.y = 0.0;
    p.z = 0.0;
    local_b8.x = 0.0;
    local_b8.y = 0.0;
    local_b8.z = 1.0;
    this_00 = &(pIVar11->super_IfcElementarySurface).super_IfcSurface.field_0x40;
    local_e8 = result;
    pIVar12 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                        ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)this_00);
    if (pIVar12->field_0x50 == '\x01') {
      pIVar12 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                          ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)this_00);
      this = (Lazy *)STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                               ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *
                                )&(pIVar12->super_IfcPlacement).field_0x48);
      in = STEP::Lazy::operator_cast_to_IfcDirection_(this);
      ConvertDirection(&local_b8,in);
    }
    pIVar12 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                        ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)this_00);
    in_00 = STEP::Lazy::operator_cast_to_IfcCartesianPoint_
                      ((Lazy *)&(pIVar12->super_IfcPlacement).super_IfcGeometricRepresentationItem.
                                field_0x30);
    ConvertCartesianPoint(&p,in_00);
    STEP::EXPRESS::ENUMERATION::ENUMERATION((ENUMERATION *)&vmin,&hs->AgreementFlag);
    bVar5 = IsTrue((BOOLEAN *)&vmin);
    STEP::EXPRESS::
    PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~PrimitiveDataType
              ((PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&vmin);
    pTVar4 = local_e0;
    pTVar3 = local_e8;
    if (!bVar5) {
      local_b8.x = -local_b8.x;
      local_b8.y = -local_b8.y;
      local_b8.z = -local_b8.z;
    }
    puVar17 = (local_e0->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (local_e0->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&local_e8->mVerts,
               ((long)(local_e0->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_e0->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&pTVar3->mVertcnt,
               (long)(pTVar4->mVertcnt).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pTVar4->mVertcnt).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    local_ec = 0;
    for (; puVar17 != puVar2; puVar17 = puVar17 + 1) {
      local_f0 = 0;
      uVar18 = (ulong)local_ec;
      paVar14 = (local_e0->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start;
      bVar5 = -1e-06 < (paVar14[uVar18].z - p.z) * local_b8.z +
                       (paVar14[uVar18].x - p.x) * local_b8.x +
                       (paVar14[uVar18].y - p.y) * local_b8.y;
      uVar16 = 0;
      uVar18 = 1;
      uVar15 = local_ec;
      while( true ) {
        pTVar4 = local_e8;
        uVar8 = *puVar17;
        if ((ulong)uVar8 <= uVar18 - 1) break;
        paVar14 = (local_e0->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        e0 = paVar14 + uVar15;
        iVar7 = (int)uVar18;
        if (uVar18 == uVar8) {
          iVar7 = 0;
        }
        vmin.z = paVar14[iVar7 + local_ec].z;
        vmin.x = paVar14[iVar7 + local_ec].x;
        vmin.y = paVar14[iVar7 + local_ec].y;
        vmax.x = 0.0;
        vmax.y = 0.0;
        vmax.z = 0.0;
        bVar6 = IntersectSegmentPlane(&p,&local_b8,e0,&vmin,bVar5,&vmax);
        pTVar4 = local_e8;
        if (bVar6) {
          if (bVar5 == false) {
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&local_e8->mVerts,&vmax);
            local_f0 = local_f0 + 1;
          }
          else {
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&local_e8->mVerts,e0);
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&pTVar4->mVerts,&vmax);
            local_f0 = local_f0 + 2;
          }
          uVar16 = (ulong)local_f0;
          bVar5 = (bool)(bVar5 ^ 1);
        }
        else {
          bVar5 = bVar5 != false;
          if (bVar5) {
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&local_e8->mVerts,e0);
            local_f0 = local_f0 + 1;
            uVar16 = (ulong)local_f0;
          }
        }
        uVar15 = uVar15 + 1;
        uVar18 = uVar18 + 1;
      }
      if ((uint)uVar16 != 0) {
        vmin.x = 0.0;
        vmin.y = 0.0;
        vmin.z = 0.0;
        vmax.x = 0.0;
        vmax.y = 0.0;
        vmax.z = 0.0;
        ArrayBounds<aiVector3t<double>>
                  ((local_e8->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -uVar16,(uint)uVar16,&vmin,&vmax);
        fz.epsilon = ((vmax.z - vmin.z) * (vmax.z - vmin.z) +
                     (vmax.x - vmin.x) * (vmax.x - vmin.x) + (vmax.y - vmin.y) * (vmax.y - vmin.y))
                     / 1000000.0;
        _Var13._M_current =
             (pTVar4->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        _Var13 = std::
                 __unique<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>>
                           (_Var13._M_current + -(ulong)local_f0,_Var13,
                            (_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>)fz.epsilon);
        __last._M_current =
             (pTVar4->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (_Var13._M_current != __last._M_current) {
          local_f0 = local_f0 + (int)(((long)__last._M_current - (long)_Var13._M_current) / -0x18);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::erase
                    (&pTVar4->mVerts,(const_iterator)_Var13._M_current,__last);
          __last._M_current =
               (pTVar4->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        bVar5 = FuzzyVectorCompare::operator()
                          (&fz,__last._M_current + -(ulong)local_f0,__last._M_current + -1);
        if (bVar5) {
          ppaVar1 = &(pTVar4->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + -1;
          local_f0 = local_f0 - 1;
        }
        if (local_f0 < 3) {
          paVar14 = (pTVar4->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          vVar9 = local_f0;
          while( true ) {
            paVar14 = paVar14 + -1;
            bVar5 = vVar9 == 0;
            vVar9 = vVar9 - 1;
            if (bVar5) break;
            (pTVar4->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish = paVar14;
          }
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&pTVar3->mVertcnt,&local_f0);
        }
        uVar8 = *puVar17;
      }
      local_ec = uVar8 + local_ec;
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5016d7);
    return;
  }
  LogFunctions<Assimp::IFCImporter>::LogError(unaff_retaddr);
  return;
}

Assistant:

void ProcessBooleanHalfSpaceDifference(const Schema_2x3::IfcHalfSpaceSolid* hs, TempMesh& result,
    const TempMesh& first_operand,
    ConversionData& /*conv*/)
{
    ai_assert(hs != NULL);

    const Schema_2x3::IfcPlane* const plane = hs->BaseSurface->ToPtr<Schema_2x3::IfcPlane>();
    if(!plane) {
        IFCImporter::LogError("expected IfcPlane as base surface for the IfcHalfSpaceSolid");
        return;
    }

    // extract plane base position vector and normal vector
    IfcVector3 p,n(0.f,0.f,1.f);
    if (plane->Position->Axis) {
        ConvertDirection(n,plane->Position->Axis.Get());
    }
    ConvertCartesianPoint(p,plane->Position->Location);

    if(!IsTrue(hs->AgreementFlag)) {
        n *= -1.f;
    }

    // clip the current contents of `meshout` against the plane we obtained from the second operand
    const std::vector<IfcVector3>& in = first_operand.mVerts;
    std::vector<IfcVector3>& outvert = result.mVerts;

    std::vector<unsigned int>::const_iterator begin = first_operand.mVertcnt.begin(),
        end = first_operand.mVertcnt.end(), iit;

    outvert.reserve(in.size());
    result.mVertcnt.reserve(first_operand.mVertcnt.size());

    unsigned int vidx = 0;
    for(iit = begin; iit != end; vidx += *iit++) {

        unsigned int newcount = 0;
        bool isAtWhiteSide = (in[vidx] - p) * n > -1e-6;
        for( unsigned int i = 0; i < *iit; ++i ) {
            const IfcVector3& e0 = in[vidx + i], e1 = in[vidx + (i + 1) % *iit];

            // does the next segment intersect the plane?
            IfcVector3 isectpos;
            if( IntersectSegmentPlane(p, n, e0, e1, isAtWhiteSide, isectpos) ) {
                if( isAtWhiteSide ) {
                    // e0 is on the right side, so keep it
                    outvert.push_back(e0);
                    outvert.push_back(isectpos);
                    newcount += 2;
                }
                else {
                    // e0 is on the wrong side, so drop it and keep e1 instead
                    outvert.push_back(isectpos);
                    ++newcount;
                }
                isAtWhiteSide = !isAtWhiteSide;
            }
            else
            {
                if( isAtWhiteSide ) {
                    outvert.push_back(e0);
                    ++newcount;
                }
            }
        }

        if (!newcount) {
            continue;
        }

        IfcVector3 vmin,vmax;
        ArrayBounds(&*(outvert.end()-newcount),newcount,vmin,vmax);

        // filter our IfcFloat points - those may happen if a point lies
        // directly on the intersection line. However, due to IfcFloat
        // precision a bitwise comparison is not feasible to detect
        // this case.
        const IfcFloat epsilon = (vmax-vmin).SquareLength() / 1e6f;
        FuzzyVectorCompare fz(epsilon);

        std::vector<IfcVector3>::iterator e = std::unique( outvert.end()-newcount, outvert.end(), fz );

        if (e != outvert.end()) {
            newcount -= static_cast<unsigned int>(std::distance(e,outvert.end()));
            outvert.erase(e,outvert.end());
        }
        if (fz(*( outvert.end()-newcount),outvert.back())) {
            outvert.pop_back();
            --newcount;
        }
        if(newcount > 2) {
            result.mVertcnt.push_back(newcount);
        }
        else while(newcount-->0) {
            result.mVerts.pop_back();
        }

    }
    IFCImporter::LogDebug("generating CSG geometry by plane clipping (IfcBooleanClippingResult)");
}